

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall moira::Moira::dump16(Moira *this,char *str,u16 *values,int cnt)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  StrWriter writer;
  StrWriter local_70;
  
  local_70.style = &this->dataStyle;
  local_70.tab.raw = 8;
  local_70.comment[0] = '\0';
  if (0 < cnt) {
    uVar5 = 0;
    local_70.base = str;
    local_70.ptr = str;
    do {
      if ((uVar5 != 0) && (0 < (this->dataStyle).tab)) {
        iVar4 = 0;
        do {
          pcVar1 = local_70.ptr + 1;
          *local_70.ptr = ' ';
          iVar4 = iVar4 + 1;
          local_70.ptr = pcVar1;
        } while (iVar4 < (this->dataStyle).tab);
      }
      StrWriter::operator<<(&local_70,(UInt16)values[uVar5]);
      cVar2 = local_70.comment[0];
      pcVar3 = local_70.ptr;
      pcVar1 = local_70.comment;
      while (pcVar1 = pcVar1 + 1, cVar2 != '\0') {
        local_70.ptr = pcVar3 + 1;
        *pcVar3 = cVar2;
        pcVar3 = local_70.ptr;
        cVar2 = *pcVar1;
      }
      *pcVar3 = '\0';
      uVar5 = uVar5 + 1;
      local_70.ptr = pcVar3;
    } while (uVar5 != (uint)cnt);
  }
  return;
}

Assistant:

void
Moira::dump16(char *str, u16 values[], int cnt) const
{
    StrWriter writer(str, dataStyle);

    for (int i = 0; i < cnt; i++) {

        for (int j = 0; i && j < dataStyle.tab; j++) writer << ' ';
        writer << UInt16{values[i]} << Finish{};
    }
}